

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O0

void HBLAS3::
     hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,double,double,(char)67,(char)78,100ul,100ul,100ul>
               (void)

{
  bool bVar1;
  ostream *poVar2;
  quaternion<double> *C_00;
  quaternion<double> *B_00;
  ostream *poVar3;
  ostream *this;
  quaternion<double> *A_00;
  ostream *this_00;
  ostream *poVar4;
  reference pvVar5;
  reference this_01;
  type Y;
  reference pvVar6;
  rep_conflict rVar7;
  value_type tstVal;
  quaternion<double> refVal;
  size_t indx;
  size_t i;
  int32_t BStart;
  size_t j;
  int32_t BStride;
  duration<double,_std::ratio<1L,_1L>_> gemmDur;
  time_point gemmEnd;
  time_point gemmStart;
  string BetaFstr;
  string AlphaFstr;
  string BFstr;
  string AFstr;
  double BETA;
  double ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> SCR;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> CC;
  quaternion<double> *x_2;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end0;
  iterator __begin0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> C;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> B;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  size_t LDC;
  size_t LDB;
  size_t LDA;
  size_t NM;
  size_t KM;
  size_t NK;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9b8;
  undefined1 pv_;
  quaternion<double> *__y;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  *in_stack_fffffffffffff9c0;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff9cc;
  allocator_type *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  quaternion<double> *in_stack_fffffffffffff9e0;
  reference in_stack_fffffffffffff9e8;
  size_type __n;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 uVar9;
  double ALPHA_00;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffffa08;
  int32_t in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  undefined4 uVar10;
  size_type __n_00;
  reference __y_00;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 uVar11;
  int32_t iVar12;
  int32_t LDB_00;
  int32_t LDC_00;
  basic_cstring<const_char> local_480 [15];
  undefined1 local_390 [32];
  undefined8 local_370;
  undefined1 local_308 [24];
  undefined1 local_2f0 [16];
  basic_cstring<const_char> local_2e0;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  size_type local_270;
  ulong local_268;
  int local_25c;
  ulong local_258;
  undefined4 local_24c;
  rep local_248;
  duration<double,_std::ratio<1L,_1L>_> local_240;
  undefined8 local_238;
  undefined8 local_230;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  double local_1a8;
  double local_1a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_190;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_178;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  reference local_140;
  quaternion<double> *local_138;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_130;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  reference local_100;
  quaternion<double> *local_f8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_f0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  reference local_c0;
  quaternion<double> *local_b8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_98;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_78 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = 10000;
  local_10 = 10000;
  local_18 = 10000;
  local_20 = 100;
  local_28 = 100;
  local_30 = 100;
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22e764);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22e790);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22e7b5);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22e7e1);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22e806);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22e832);
  local_a8 = &local_48;
  local_b0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff9b8);
  local_b8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff9b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff9c0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_b0);
    genRandom<HAXX::quaternion<double>>();
    local_c0->_M_real = local_e0;
    local_c0->_M_imag_i = local_d8;
    local_c0->_M_imag_j = local_d0;
    local_c0->_M_imag_k = local_c8;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_b0);
  }
  local_e8 = local_78;
  local_f0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff9b8);
  local_f8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff9b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff9c0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_f0);
    genRandom<HAXX::quaternion<double>>();
    local_100->_M_real = local_120;
    local_100->_M_imag_i = local_118;
    local_100->_M_imag_j = local_110;
    local_100->_M_imag_k = local_108;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_f0);
  }
  local_128 = &local_98;
  local_130._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff9b8);
  local_138 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        (in_stack_fffffffffffff9b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff9c0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    if (!bVar1) break;
    local_140 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_130);
    genRandom<HAXX::quaternion<double>>();
    local_140->_M_real = local_160;
    local_140->_M_imag_i = local_158;
    local_140->_M_imag_j = local_150;
    local_140->_M_imag_k = local_148;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_130);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),in_stack_fffffffffffffa08
            );
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22eb32);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x22eb5b);
  local_1a0 = genRandom<double>();
  local_1a8 = genRandom<double>();
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<double>();
  t_str<double>();
  std::operator<<((ostream *)&std::cout,"\n HBLAS GEMM TEST: \n");
  std::operator<<((ostream *)&std::cout,"   - _F =      DOUBLE    \n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AF =     ");
  poVar2 = std::operator<<(poVar2,local_1c8);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BF =     ");
  poVar2 = std::operator<<(poVar2,local_1e8);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AlphaF = ");
  poVar2 = std::operator<<(poVar2,local_208);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BetaF =  ");
  poVar2 = std::operator<<(poVar2,local_228);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _TA =     ");
  poVar2 = std::operator<<(poVar2,'C');
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _TB =     ");
  C_00 = (quaternion<double> *)std::operator<<(poVar2,'N');
  LDC_00 = (int32_t)poVar2;
  std::operator<<((ostream *)C_00,"\n");
  std::operator<<((ostream *)&std::cout,"\n   PROBLEM DIMENSIONS\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - N =     ");
  B_00 = (quaternion<double> *)std::ostream::operator<<(poVar2,100);
  LDB_00 = (int32_t)poVar2;
  std::operator<<((ostream *)B_00,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - M =     ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,100);
  iVar12 = (int32_t)poVar2;
  std::operator<<(poVar3,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - K =     ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar3,"\n");
  this = std::operator<<((ostream *)&std::cout,"     - LDA =   ");
  A_00 = (quaternion<double> *)std::ostream::operator<<(this,local_20);
  std::operator<<((ostream *)A_00,"\n");
  this_00 = std::operator<<((ostream *)&std::cout,"     - LDB =   ");
  poVar4 = (ostream *)std::ostream::operator<<(this_00,local_28);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"     - LDC =   ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  local_230 = std::chrono::_V2::system_clock::now();
  __n_00 = 0;
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
            (&local_48,0);
  uVar11 = (undefined4)local_20;
  pvVar5 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](local_78,__n_00);
  uVar8 = (int)local_28;
  this_01 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
            operator[](&local_98,__n_00);
  __y = (quaternion<double> *)CONCAT44(uVar9,uVar11);
  __y_00 = pvVar5;
  HAXX::HBLAS_GEMM<double,HAXX::quaternion<double>,HAXX::quaternion<double>,double,double>
            ((char)((ulong)poVar2 >> 0x38),(char)((ulong)poVar2 >> 0x30),(int32_t)poVar2,
             (int32_t)((ulong)poVar3 >> 0x20),(int32_t)poVar3,(double)this,A_00,iVar12,B_00,LDB_00,
             (double)this_00,C_00,LDC_00);
  local_238 = std::chrono::_V2::system_clock::now();
  Y = std::chrono::operator-
                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)pvVar5);
  local_248 = Y.__r;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this_01,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)
             CONCAT44(in_stack_fffffffffffff9cc,uVar8));
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar2," * GEMM took ");
  rVar7 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_240);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar7);
  std::operator<<(poVar3," s\n\n");
  local_24c = 1;
  for (local_258 = 0; uVar8 = (undefined4)((ulong)__y >> 0x20), local_258 < 100;
      local_258 = local_258 + 1) {
    local_25c = (int)local_258 * (int)local_28;
    __n = 0;
    ALPHA_00 = local_1a0;
    pvVar5 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_48,0);
    iVar12 = (int32_t)((ulong)pvVar5 >> 0x20);
    uVar10 = (undefined4)local_20;
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_78,(long)local_25c);
    uVar9 = local_24c;
    pvVar5 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_190,__n);
    __y = (quaternion<double> *)CONCAT44(uVar8,uVar9);
    uVar8 = 1;
    HAXX::HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,double,double>
              ((char)((uint)uVar10 >> 0x18),in_stack_fffffffffffffa10,iVar12,ALPHA_00,
               (quaternion<double> *)CONCAT44(uVar9,in_stack_fffffffffffff9f8),
               (int32_t)(__n >> 0x20),in_stack_fffffffffffff9e8,(int32_t)poVar2,
               (double)in_stack_fffffffffffff9e0,(quaternion<double> *)Y.__r,(int32_t)__n_00);
    for (local_268 = 0; local_268 < 100; local_268 = local_268 + 1) {
      local_270 = local_268 + local_258 * local_30;
      in_stack_fffffffffffff9e8 =
           std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_190,local_268);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_178,local_270);
      HAXX::operator*(&pvVar5->_M_real,__y);
      HAXX::operator+(pvVar5,__y);
      pvVar6 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
               operator[](&local_98,local_270);
      local_2d0 = pvVar6->_M_real;
      local_2c8 = pvVar6->_M_imag_i;
      local_2c0 = pvVar6->_M_imag_j;
      local_2b8 = pvVar6->_M_imag_k;
      do {
        in_stack_fffffffffffff9e0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_2e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)pvVar5);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff9e0,&local_2e0,0x88,local_2f0);
        HAXX::inv<double>((quaternion<double> *)CONCAT44(uVar10,in_stack_fffffffffffffa10));
        HAXX::operator*((quaternion<double> *)CONCAT44(uVar11,in_stack_fffffffffffffa58),__y_00);
        local_370 = 0x3ff0000000000000;
        HAXX::operator-(pvVar5,&__y->_M_real);
        pv_ = (undefined1)((ulong)__y >> 0x38);
        HAXX::norm<double>(in_stack_fffffffffffff9e0);
        boost::test_tools::assertion_result::assertion_result((assertion_result *)pvVar5,(bool)pv_);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),(char (*) [7])pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]> *)
                   CONCAT44(in_stack_fffffffffffff9cc,uVar8),(unsigned_long *)pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),(char (*) [6])pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),(unsigned_long *)pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),(char (*) [16])pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),(char (*) [15])pvVar5);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)CONCAT44(in_stack_fffffffffffff9cc,uVar8),pvVar5);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (local_480,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        __y = (quaternion<double> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_308,local_390,local_480,0x88,1);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x22f5e5);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)0x22f5f2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x22f5ff);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)0x22f60c);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x22f619);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)0x22f626);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x22f633);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>
                            *)0x22f640);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x22f64d);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this_01
            );
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this_01
            );
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this_01
            );
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this_01
            );
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this_01
            );
  return;
}

Assistant:

void hblas3_gemm() {

  size_t NK = N*K;
  size_t KM = K*M;
  size_t NM = N*M;

  size_t LDA = ( _TA == 'N' ) ? N : K;
  size_t LDB = ( _TB == 'N' ) ? K : M;
  size_t LDC = N;

  // Random Quaternion vectors and matricies
  std::vector<_AF> A(NK);
  std::vector<_BF> B(KM);
  std::vector<qd>  C(NM);

  for(auto &x : A) x = genRandom<_AF>();
  for(auto &x : B) x = genRandom<_BF>();
  for(auto &x : C) x = genRandom<qd> ();

  std::vector<qd> CC(C);
  std::vector<qd> SCR(N);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA  = genRandom<_BetaF>();


  std::string AFstr     = t_str<_AF>(); 
  std::string BFstr     = t_str<_BF>(); 
  std::string AlphaFstr = t_str<_AlphaF>(); 
  std::string BetaFstr  = t_str<_BetaF>(); 
                
                


  std::cout << "\n HBLAS GEMM TEST: \n";
  std::cout << "   - _F =      DOUBLE    \n";
  std::cout << "   - _AF =     " << AFstr << "\n";
  std::cout << "   - _BF =     " << BFstr << "\n";
  std::cout << "   - _AlphaF = " << AlphaFstr << "\n";
  std::cout << "   - _BetaF =  " << BetaFstr << "\n";
  std::cout << "   - _TA =     " << _TA << "\n";
  std::cout << "   - _TB =     " << _TB << "\n";

  std::cout << "\n   PROBLEM DIMENSIONS\n";
  std::cout << "     - N =     " << N << "\n";
  std::cout << "     - M =     " << M << "\n";
  std::cout << "     - K =     " << K << "\n";
  std::cout << "     - LDA =   " << LDA << "\n";
  std::cout << "     - LDB =   " << LDB << "\n";
  std::cout << "     - LDC =   " << LDC << "\n";



  std::cout << "\n";



  auto gemmStart = std::chrono::high_resolution_clock::now();

  HBLAS_GEMM(_TA, _TB, N, M, K, ALPHA, &A[0], LDA, &B[0], LDB, BETA, 
    &C[0], LDC);

  auto gemmEnd = std::chrono::high_resolution_clock::now();

  std::chrono::duration<double> gemmDur = gemmEnd - gemmStart;
  std::cout << std::endl << " * GEMM took " << gemmDur.count() 
    << " s\n\n";


  HAXX_INT BStride = 1;
  if( _TB != 'N' ) BStride = LDB;
  if( _TB == 'C' ) 
    for(auto &x : B) x = HAXX::conj(x); 

  for(size_t j = 0; j < M; j++) {

    HAXX_INT BStart = j;
    if( _TB == 'N' ) BStart *= LDB;

    HBLAS_GEMV(_TA, N, K, ALPHA, &A[0], LDA, &B[BStart], BStride, 0., 
      &SCR[0], 1);

    for(size_t i = 0; i < N; i++) {

      size_t indx = RANK2_INDX(i,j,LDC);
      auto refVal = SCR[i] + BETA*CC[indx];
      auto tstVal = C[indx];

      BOOST_CHECK_MESSAGE( 
        CMP_Q( refVal, tstVal ),
        "\n i = " << i << 
          " j = " << j << 
          ", HBLAS_GEMM = " << tstVal << 
          ", REFERENCE = "  << refVal 
      );
    }
  }

}